

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void wasm::writeBase64VLQ(ostream *out,int32_t n)

{
  uint uVar1;
  undefined1 local_41;
  undefined1 local_40;
  undefined1 local_3c;
  undefined1 local_2c;
  undefined4 local_20;
  undefined4 local_18;
  uint32_t digit;
  uint32_t value;
  int32_t n_local;
  ostream *out_local;
  
  if (n < 0) {
    local_20 = n * -2 | 1;
  }
  else {
    local_20 = n << 1;
  }
  local_18 = local_20;
  while( true ) {
    uVar1 = local_18 & 0x1f;
    local_18 = local_18 >> 5;
    local_2c = (char)uVar1;
    if (local_18 == 0) break;
    if (uVar1 < 0x14) {
      local_3c = local_2c + 'g';
    }
    else {
      if (uVar1 < 0x1e) {
        local_40 = local_2c + '\x1c';
      }
      else {
        local_41 = '+';
        if (uVar1 != 0x1e) {
          local_41 = '/';
        }
        local_40 = local_41;
      }
      local_3c = local_40;
    }
    std::operator<<(out,local_3c);
  }
  if (uVar1 < 0x1a) {
    local_2c = local_2c + 'A';
  }
  else {
    local_2c = local_2c + 'G';
  }
  std::operator<<(out,local_2c);
  return;
}

Assistant:

static void writeBase64VLQ(std::ostream& out, int32_t n) {
  uint32_t value = n >= 0 ? n << 1 : ((-n) << 1) | 1;
  while (1) {
    uint32_t digit = value & 0x1F;
    value >>= 5;
    if (!value) {
      // last VLQ digit -- base64 codes 'A'..'Z', 'a'..'f'
      out << char(digit < 26 ? 'A' + digit : 'a' + digit - 26);
      break;
    }
    // more VLG digit will follow -- add continuation bit (0x20),
    // base64 codes 'g'..'z', '0'..'9', '+', '/'
    out << char(digit < 20
                  ? 'g' + digit
                  : digit < 30 ? '0' + digit - 20 : digit == 30 ? '+' : '/');
  }
}